

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswPairs.c
# Opt level: O2

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  abctime aVar1;
  Aig_Man_t *pAig2;
  Vec_Int_t *vIds1;
  Vec_Int_t *vIds2;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Aig_Man_t *p_00;
  abctime aVar4;
  ulong uVar5;
  char *format;
  int level;
  Aig_Man_t *pAVar6;
  int iVar7;
  Ssw_Pars_t Pars;
  
  aVar1 = Abc_Clock();
  Ssw_ManSetDefaultParams(&Pars);
  Pars.fVerbose = 1;
  pAig2 = Ssw_SignalCorrespondence(pAig,&Pars);
  vIds1 = Vec_IntAlloc(pAig->vObjs->nSize);
  vIds2 = Vec_IntAlloc(pAig->vObjs->nSize);
  iVar7 = 0;
  while( true ) {
    p = pAig->vObjs;
    if (p->nSize <= iVar7) break;
    pvVar2 = Vec_PtrEntry(p,iVar7);
    if ((pvVar2 != (void *)0x0) &&
       (uVar5 = *(ulong *)((long)pvVar2 + 0x28) & 0xfffffffffffffffe, uVar5 != 0)) {
      pAVar3 = Aig_ManObj(pAig2,*(int *)(uVar5 + 0x24));
      if (pAVar3 != (Aig_Obj_t *)0x0) {
        Vec_IntPush(vIds1,*(int *)((long)pvVar2 + 0x24));
        Vec_IntPush(vIds2,*(int *)(uVar5 + 0x24));
      }
    }
    iVar7 = iVar7 + 1;
  }
  Abc_Print((int)p,"Recorded %d pairs (before: %d  after: %d).\n",(ulong)(uint)vIds1->nSize,
            (ulong)(uint)p->nSize,(ulong)(uint)pAig2->vObjs->nSize);
  p_00 = Ssw_SignalCorrespondenceWithPairs(pAig,pAig2,vIds1,vIds2,&Pars);
  Vec_IntFree(vIds1);
  Vec_IntFree(vIds2);
  pAVar6 = p_00;
  iVar7 = Ssw_MiterStatus(p_00,1);
  level = (int)pAVar6;
  if (iVar7 == 0) {
    format = "Verification failed with the counter-example.  ";
  }
  else {
    if (iVar7 != 1) {
      Abc_Print(level,"Verification UNDECIDED. Remaining registers %d (total %d).  ",
                (ulong)(uint)p_00->nRegs,(ulong)(uint)(pAig2->nRegs + pAig->nRegs));
      goto LAB_005651a2;
    }
    format = "Verification successful.  ";
  }
  Abc_Print(level,format);
LAB_005651a2:
  Abc_Print(level,"%s =","Time");
  aVar4 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar4 - aVar1) / 1000000.0);
  Aig_ManStop(pAig2);
  return p_00;
}

Assistant:

Aig_Man_t * Ssw_SignalCorrespondeceTestPairs( Aig_Man_t * pAig )
{
    Aig_Man_t * pAigNew, * pAigRes;
    Ssw_Pars_t Pars, * pPars = &Pars;
    Vec_Int_t * vIds1, * vIds2;
    Aig_Obj_t * pObj, * pRepr;
    int RetValue, i;
    abctime clk = Abc_Clock();
    Ssw_ManSetDefaultParams( pPars );
    pPars->fVerbose = 1;
    pAigNew = Ssw_SignalCorrespondence( pAig, pPars );
    // record pairs of equivalent nodes
    vIds1 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    vIds2 = Vec_IntAlloc( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_Regular((Aig_Obj_t *)pObj->pData);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ManObj(pAigNew, pRepr->Id) == NULL )
            continue;
/*
        if ( Aig_ObjIsNode(pObj) )
            Abc_Print( 1, "n " );
        else if ( Saig_ObjIsPi(pAig, pObj) )
            Abc_Print( 1, "pi " );
        else if ( Saig_ObjIsLo(pAig, pObj) )
            Abc_Print( 1, "lo " );
*/
        Vec_IntPush( vIds1, Aig_ObjId(pObj) );
        Vec_IntPush( vIds2, Aig_ObjId(pRepr) );
    }
    Abc_Print( 1, "Recorded %d pairs (before: %d  after: %d).\n", Vec_IntSize(vIds1), Aig_ManObjNumMax(pAig), Aig_ManObjNumMax(pAigNew) );
    // try the new AIGs
    pAigRes = Ssw_SignalCorrespondenceWithPairs( pAig, pAigNew, vIds1, vIds2, pPars );
    Vec_IntFree( vIds1 );
    Vec_IntFree( vIds2 );
    // report the results
    RetValue = Ssw_MiterStatus( pAigRes, 1 );
    if ( RetValue == 1 )
        Abc_Print( 1, "Verification successful.  " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "Verification failed with the counter-example.  " );
    else
        Abc_Print( 1, "Verification UNDECIDED. Remaining registers %d (total %d).  ",
            Aig_ManRegNum(pAigRes), Aig_ManRegNum(pAig) + Aig_ManRegNum(pAigNew) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    // cleanup
    Aig_ManStop( pAigNew );
    return pAigRes;
}